

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O3

int extensionSupportedGLX(char *extension)

{
  GLFWbool GVar1;
  char *extensions;
  
  extensions = (*_glfw.glx.QueryExtensionsString)(_glfw.x11.display,_glfw.x11.screen);
  if ((extensions != (char *)0x0) &&
     (GVar1 = _glfwStringInExtensionString(extension,extensions), GVar1 != 0)) {
    return 1;
  }
  return 0;
}

Assistant:

static int extensionSupportedGLX(const char* extension)
{
    const char* extensions =
        glXQueryExtensionsString(_glfw.x11.display, _glfw.x11.screen);
    if (extensions)
    {
        if (_glfwStringInExtensionString(extension, extensions))
            return GLFW_TRUE;
    }

    return GLFW_FALSE;
}